

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

int64_t __thiscall
aeron::archive::AeronArchive::awaitSessionOpened(AeronArchive *this,int64_t correlationId)

{
  uint16_t uVar1;
  pointer pCVar2;
  duration dVar3;
  ulong uVar4;
  element_type *this_00;
  AgentInvoker<aeron::ClientConductor> *this_01;
  ArchiveException *pAVar5;
  string *__rhs;
  int64_t iVar6;
  char *pcVar7;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_10a;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Value local_2c;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_28;
  Value code;
  TimePoint local_20;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  deadline;
  int64_t correlationId_local;
  AeronArchive *this_local;
  
  deadline.__d.__r = (duration)(duration)correlationId;
  tStack_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_20.__d.__r =
       (duration)std::chrono::operator+(&stack0xffffffffffffffd8,&this->messageTimeoutNs_);
  awaitConnection(this,&local_20);
  do {
    pollNextResponse(this,(int64_t)deadline.__d.__r,&local_20);
    pCVar2 = std::
             unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
             ::operator->(&this->controlResponsePoller_);
    dVar3.__r = ControlResponsePoller::correlationId(pCVar2);
    if ((duration)dVar3.__r == deadline.__d.__r) {
      pCVar2 = std::
               unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
               ::operator->(&this->controlResponsePoller_);
      uVar4 = ControlResponsePoller::templateId(pCVar2);
      uVar1 = io::aeron::archive::codecs::ControlResponse::sbeTemplateId();
      if (uVar4 == uVar1) {
        pCVar2 = std::
                 unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                 ::operator->(&this->controlResponsePoller_);
        local_2c = ControlResponsePoller::code(pCVar2);
        if (local_2c == OK) {
          pCVar2 = std::
                   unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                   ::operator->(&this->controlResponsePoller_);
          iVar6 = ControlResponsePoller::controlSessionId(pCVar2);
          return iVar6;
        }
        if (local_2c == ERROR) {
          local_10a = 1;
          pAVar5 = (ArchiveException *)__cxa_allocate_exception(0x48);
          pCVar2 = std::
                   unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                   ::operator->(&this->controlResponsePoller_);
          __rhs = ControlResponsePoller::errorMessage_abi_cxx11_(pCVar2);
          std::operator+(&local_90,"unexpected response: ",__rhs);
          std::operator+(&local_70,&local_90,", relevant id: ");
          pCVar2 = std::
                   unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                   ::operator->(&this->controlResponsePoller_);
          iVar6 = ControlResponsePoller::relevantId(pCVar2);
          std::__cxx11::to_string(&local_c0,iVar6);
          std::operator+(&local_50,&local_70,&local_c0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_e0,
                     "std::int64_t aeron::archive::AeronArchive::awaitSessionOpened(std::int64_t)",
                     &local_e1);
          pcVar7 = aeron::util::past_prefix
                             ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                             );
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_108,pcVar7,&local_109);
          ArchiveException::ArchiveException(pAVar5,&local_50,&local_e0,&local_108,0x147);
          local_10a = 0;
          __cxa_throw(pAVar5,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
        }
        pAVar5 = (ArchiveException *)__cxa_allocate_exception(0x48);
        std::__cxx11::to_string(&local_150,local_2c);
        std::operator+(&local_130,"unexpected response: code=",&local_150);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_170,
                   "std::int64_t aeron::archive::AeronArchive::awaitSessionOpened(std::int64_t)",
                   &local_171);
        pcVar7 = aeron::util::past_prefix
                           ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                           );
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_198,pcVar7,&local_199);
        ArchiveException::ArchiveException(pAVar5,&local_130,&local_170,&local_198,0x14a);
        __cxa_throw(pAVar5,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
      }
    }
    this_00 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->aeron_);
    this_01 = Aeron::conductorAgentInvoker(this_00);
    concurrent::AgentInvoker<aeron::ClientConductor>::invoke(this_01);
  } while( true );
}

Assistant:

std::int64_t AeronArchive::awaitSessionOpened(std::int64_t correlationId) {
    auto deadline = Clock::now() + messageTimeoutNs_;

    awaitConnection(deadline);

    while (true) {
        pollNextResponse(correlationId, deadline);

        if (controlResponsePoller_->correlationId() != correlationId ||
            controlResponsePoller_->templateId() != codecs::ControlResponse::sbeTemplateId()) {
            aeron_->conductorAgentInvoker().invoke();
            continue;
        }

        auto code = controlResponsePoller_->code();
        if (code != codecs::ControlResponseCode::OK) {
            if (code == codecs::ControlResponseCode::ERROR) {
                throw ArchiveException("unexpected response: " + controlResponsePoller_->errorMessage() +
                                           ", relevant id: " + std::to_string(controlResponsePoller_->relevantId()),
                                       SOURCEINFO);
            }

            throw ArchiveException("unexpected response: code=" + std::to_string(code), SOURCEINFO);
        }

        return controlResponsePoller_->controlSessionId();
    }
}